

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleRateConverter.cpp
# Opt level: O0

void __thiscall
MT32Emu::SampleRateConverter::getOutputSamples(SampleRateConverter *this,float *buffer,uint length)

{
  uint length_local;
  float *buffer_local;
  SampleRateConverter *this_local;
  
  if ((this->useSynthDelegate & 1U) == 0) {
    InternalResampler::getOutputSamples((InternalResampler *)this->srcDelegate,buffer,length);
  }
  else {
    Synth::render((Synth *)this->srcDelegate,buffer,length);
  }
  return;
}

Assistant:

void SampleRateConverter::getOutputSamples(float *buffer, unsigned int length) {
	if (useSynthDelegate) {
		static_cast<Synth *>(srcDelegate)->render(buffer, length);
		return;
	}

#if MT32EMU_WITH_LIBSOXR_RESAMPLER
	static_cast<SoxrAdapter *>(srcDelegate)->getOutputSamples(buffer, length);
#elif MT32EMU_WITH_LIBSAMPLERATE_RESAMPLER
	static_cast<SamplerateAdapter *>(srcDelegate)->getOutputSamples(buffer, length);
#elif MT32EMU_WITH_INTERNAL_RESAMPLER
	static_cast<InternalResampler *>(srcDelegate)->getOutputSamples(buffer, length);
#else
	Synth::muteSampleBuffer(buffer, length);
#endif
}